

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O1

int nn_chunk_realloc(size_t size,void **chunk)

{
  void *p;
  ulong __n;
  bool bVar1;
  int iVar2;
  nn_chunk *pnVar3;
  ulong uVar4;
  int unaff_EBP;
  void *pvVar5;
  void *new_ptr;
  
  p = *chunk;
  pnVar3 = nn_chunk_getptr(p);
  if ((pnVar3->refcount).n != 1) goto LAB_00110629;
  __n = pnVar3->size;
  uVar4 = size - __n;
  if (size < __n || uVar4 == 0) {
    pnVar3->size = size;
LAB_001105ba:
    unaff_EBP = 0;
LAB_001105bc:
    bVar1 = false;
  }
  else {
    if (0xffffffffffffffdf < size) {
      unaff_EBP = -0xc;
      goto LAB_001105bc;
    }
    if (uVar4 <= (ulong)((long)p + (-0x20 - (long)pnVar3))) {
      pvVar5 = (void *)((long)p - uVar4);
      new_ptr = pvVar5;
      memmove(pvVar5,p,__n);
      pnVar3->size = size;
      nn_putl((uint8_t *)((long)pvVar5 + -4),0xdeadcafe);
      nn_putl((uint8_t *)((long)pvVar5 + -8),((int)pvVar5 - (int)pnVar3) - 0x20);
      *chunk = p;
      goto LAB_001105ba;
    }
    bVar1 = true;
  }
  if (!bVar1) {
    return unaff_EBP;
  }
LAB_00110629:
  new_ptr = (void *)0x0;
  iVar2 = nn_chunk_alloc(size,0,&new_ptr);
  pvVar5 = new_ptr;
  if (iVar2 == 0) {
    memcpy(new_ptr,&pnVar3[1].size,pnVar3->size);
    *chunk = pvVar5;
    nn_chunk_free(p);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int nn_chunk_realloc (size_t size, void **chunk)
{
    struct nn_chunk *self;
    void *new_ptr;
    size_t hdr_size;
    int rc;
    void *p = *chunk;

    self = nn_chunk_getptr (p);

    /*  Check if we only have one reference to this object, in that case we can
        reallocate the memory chunk. */
    if (self->refcount.n == 1) {

         size_t grow;
         size_t empty;

        /*  If the new size is smaller than the old size, we can just keep
            it.  Avoid an allocation.  We'll have wasted & lost data
            at the end, but who cares.  This is basically "chop". */
        if (size <= self->size) {
            self->size = size;
            return (0);
        }

        hdr_size = nn_chunk_hdrsize ();
        empty = (uint8_t*) p - (uint8_t*) self - hdr_size;
        grow = size - self->size;

        /* Check for overflow. */
        if (hdr_size + size < size) {
            return -ENOMEM;
	}

        /* Can we grow into empty space? */
        if (grow <= empty) {
            new_ptr = (uint8_t *)p - grow;
            memmove (new_ptr, p, self->size);
            self->size = size;

            /*  Recalculate the size of empty space, and reconstruct
                the tag and prefix. */
            empty = (uint8_t *)new_ptr - (uint8_t *)self - hdr_size;
            nn_putl ((uint8_t*) (((uint32_t*) new_ptr) - 1), NN_CHUNK_TAG);
            nn_putl ((uint8_t*) (((uint32_t*) new_ptr) - 2), (uint32_t) empty);
            *chunk = p;
            return (0);
        }
    }

    /*  There are either multiple references to this memory chunk,
        or we cannot reuse the existing space.  We create a new one
        copy the data.  (This is no worse than nn_realloc, btw.) */
    new_ptr = NULL;
    rc = nn_chunk_alloc (size, 0, &new_ptr);

    if (nn_slow (rc != 0)) {
        return rc;
    }

    memcpy (new_ptr, nn_chunk_getdata (self), self->size);
    *chunk = new_ptr;
    nn_chunk_free (p);

    return 0;
}